

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O0

lzma_ret lzma_filters_update(lzma_stream *strm,lzma_filter *filters)

{
  uint64_t uVar1;
  long lVar2;
  void *local_80;
  size_t i;
  lzma_filter reversed_filters [5];
  size_t count;
  lzma_filter *filters_local;
  lzma_stream *strm_local;
  
  if ((strm->internal->next).update ==
      (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0) {
    strm_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    uVar1 = lzma_raw_encoder_memusage(filters);
    if (uVar1 == 0xffffffffffffffff) {
      strm_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
    else {
      for (reversed_filters[4].options = (void *)0x1;
          filters[(long)reversed_filters[4].options].id != 0xffffffffffffffff;
          reversed_filters[4].options = (void *)((long)reversed_filters[4].options + 1)) {
      }
      for (local_80 = (void *)0x0; local_80 < reversed_filters[4].options;
          local_80 = (void *)((long)local_80 + 1)) {
        lVar2 = (long)reversed_filters[4].options + (-1 - (long)local_80);
        reversed_filters[lVar2 + -1].options = (void *)filters[(long)local_80].id;
        reversed_filters[lVar2].id = (lzma_vli)filters[(long)local_80].options;
      }
      reversed_filters[(long)reversed_filters[4].options + -1].options = (void *)0xffffffffffffffff;
      strm_local._4_4_ =
           (*(strm->internal->next).update)
                     ((strm->internal->next).coder,strm->allocator,filters,(lzma_filter *)&i);
    }
  }
  return strm_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_update(lzma_stream *strm, const lzma_filter *filters)
{
	if (strm->internal->next.update == NULL)
		return LZMA_PROG_ERROR;

	// Validate the filter chain.
	if (lzma_raw_encoder_memusage(filters) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// The actual filter chain in the encoder is reversed. Some things
	// still want the normal order chain, so we provide both.
	size_t count = 1;
	while (filters[count].id != LZMA_VLI_UNKNOWN)
		++count;

	lzma_filter reversed_filters[LZMA_FILTERS_MAX + 1];
	for (size_t i = 0; i < count; ++i)
		reversed_filters[count - i - 1] = filters[i];

	reversed_filters[count].id = LZMA_VLI_UNKNOWN;

	return strm->internal->next.update(strm->internal->next.coder,
			strm->allocator, filters, reversed_filters);
}